

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::is_expand_op(ExprOp op)

{
  initializer_list<kratos::ExprOp> __l;
  bool bVar1;
  int iVar2;
  _Node_iterator_base<kratos::ExprOp,_false> local_60;
  _Node_iterator_base<kratos::ExprOp,_false> local_58 [3];
  allocator<kratos::ExprOp> local_3b;
  key_equal local_3a;
  hasher local_39;
  ExprOp local_38 [3];
  iterator local_20;
  size_type local_18;
  ExprOp local_10;
  ExprOp op_local;
  
  local_10 = op;
  if (is_expand_op(kratos::ExprOp)::ops == '\0') {
    iVar2 = __cxa_guard_acquire(&is_expand_op(kratos::ExprOp)::ops);
    if (iVar2 != 0) {
      local_38[0] = Concat;
      local_38[1] = 0x1d;
      local_38[2] = 0x1e;
      local_20 = local_38;
      local_18 = 3;
      std::allocator<kratos::ExprOp>::allocator(&local_3b);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
      ::unordered_set(&is_expand_op::ops,__l,0,&local_39,&local_3a,&local_3b);
      std::allocator<kratos::ExprOp>::~allocator(&local_3b);
      __cxa_atexit(std::
                   unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                   ::~unordered_set,&is_expand_op::ops,&__dso_handle);
      __cxa_guard_release(&is_expand_op(kratos::ExprOp)::ops);
    }
  }
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
       ::find(&is_expand_op::ops,&local_10);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
       ::end(&is_expand_op::ops);
  bVar1 = std::__detail::operator!=(local_58,&local_60);
  return bVar1;
}

Assistant:

bool is_expand_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::Concat, ExprOp::Extend, ExprOp::Duplicate};
    return ops.find(op) != ops.end();
}